

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparspak.cpp
# Opt level: O3

void mmdupd_(int *ehead,int *neqns,int *xadj,int *adjncy,int *delta,int *mdeg,int *dhead,int *dforw,
            int *dbakw,int *qsize,int *llist,int *marker,int *maxint,int *tag)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  uint local_64;
  uint local_54;
  uint local_48;
  uint local_44;
  int local_34;
  
  local_54 = *ehead;
  if ((int)local_54 < 1) {
    return;
  }
  iVar1 = *delta;
  iVar2 = *mdeg;
  iVar12 = *tag;
LAB_00143779:
  iVar12 = iVar12 + iVar1 + iVar2;
  if (*maxint <= iVar12) {
    *tag = 1;
    uVar11 = *neqns;
    if ((int)uVar11 < 1) {
      iVar12 = 1;
    }
    else {
      uVar14 = 0;
      do {
        if (marker[uVar14] < *maxint) {
          marker[uVar14] = 0;
        }
        uVar14 = uVar14 + 1;
      } while (uVar11 != uVar14);
      iVar12 = *tag;
    }
    iVar12 = iVar12 + iVar1 + iVar2;
  }
  uVar14 = (ulong)local_54;
  iVar18 = xadj[uVar14 - 1];
  iVar13 = xadj[uVar14];
  local_34 = 0;
  local_48 = 0;
  uVar11 = 0;
  if (iVar18 < iVar13) {
    local_34 = 0;
    local_48 = 0;
    uVar11 = 0;
    iVar17 = 0;
    local_44 = 0;
    local_64 = 0;
    do {
      lVar16 = (long)iVar18;
      uVar9 = local_44;
      uVar19 = local_64;
      while( true ) {
        uVar3 = adjncy[lVar16 + -1];
        lVar15 = (long)(int)uVar3;
        if (lVar15 < 0) break;
        if (uVar3 == 0) goto LAB_00143a40;
        if (qsize[lVar15 + -1] != 0) {
          iVar17 = iVar17 + qsize[lVar15 + -1];
          marker[lVar15 + -1] = iVar12;
          local_34 = iVar17;
          if (dbakw[lVar15 + -1] == 0) {
            uVar20 = local_44;
            uVar6 = local_64;
            uVar7 = uVar3;
            uVar8 = uVar3;
            if (dforw[lVar15 + -1] != 2) {
              uVar20 = uVar3;
              local_48 = uVar3;
              uVar6 = local_44;
              uVar9 = uVar3;
              uVar3 = uVar11;
              uVar7 = uVar19;
              uVar8 = local_64;
            }
            local_64 = uVar8;
            uVar19 = uVar7;
            uVar11 = uVar3;
            llist[lVar15 + -1] = uVar6;
            local_44 = uVar20;
          }
        }
        lVar16 = lVar16 + 1;
        if (iVar13 <= lVar16) goto LAB_00143a40;
      }
      iVar18 = xadj[(ulong)-uVar3 - 1];
      iVar13 = xadj[-uVar3];
      local_44 = uVar9;
      local_64 = uVar19;
    } while (iVar18 < iVar13);
  }
LAB_00143a40:
  uVar9 = local_48;
  iVar18 = local_34;
  if ((int)uVar11 < 1) goto LAB_00143b86;
  uVar10 = (ulong)uVar11;
  bVar5 = true;
  if (dbakw[uVar10 - 1] != 0) goto LAB_00143a2e;
  *tag = *tag + 1;
  uVar9 = adjncy[(long)xadj[uVar10 - 1] + -1];
  if (uVar9 == local_54) {
    uVar9 = adjncy[xadj[uVar10 - 1]];
  }
  lVar16 = (long)(int)uVar9;
  if (dforw[lVar16 + -1] < 0) {
    iVar13 = xadj[lVar16 + -1];
    iVar17 = xadj[lVar16];
    bVar5 = true;
    if (iVar13 < iVar17) {
LAB_00143ab9:
      lVar16 = (long)iVar13;
      do {
        uVar9 = adjncy[lVar16 + -1];
        uVar21 = (ulong)uVar9;
        if (uVar9 != uVar11) {
          if ((int)uVar9 < 0) goto LAB_00143b69;
          if (uVar21 == 0) break;
          if (qsize[uVar21 - 1] != 0) {
            if (marker[uVar21 - 1] < *tag) {
              marker[uVar21 - 1] = *tag;
              iVar18 = iVar18 + qsize[uVar21 - 1];
            }
            else if (dbakw[uVar21 - 1] == 0) {
              if (dforw[uVar21 - 1] == 2) {
                qsize[uVar10 - 1] = qsize[uVar10 - 1] + qsize[uVar21 - 1];
                qsize[uVar21 - 1] = 0;
                marker[uVar21 - 1] = *maxint;
                dforw[uVar21 - 1] = -uVar11;
              }
              dbakw[uVar21 - 1] = -*maxint;
            }
          }
        }
        lVar16 = lVar16 + 1;
        if (iVar17 <= lVar16) break;
      } while( true );
    }
  }
  else {
    bVar5 = true;
    iVar18 = qsize[lVar16 + -1] + local_34;
  }
LAB_001439dc:
  do {
    do {
      lVar16 = (long)iVar18 - (long)qsize[uVar10 - 1];
      iVar13 = (uint)lVar16 + 1;
      iVar18 = dhead[lVar16];
      dforw[uVar10 - 1] = iVar18;
      dbakw[uVar10 - 1] = ~(uint)lVar16;
      if (0 < (long)iVar18) {
        dbakw[(long)iVar18 + -1] = uVar11;
      }
      dhead[lVar16] = uVar11;
      if (*mdeg <= iVar13) goto LAB_00143a2e;
      *mdeg = iVar13;
      uVar10 = (ulong)uVar11;
      while( true ) {
        uVar11 = llist[uVar10 - 1];
        uVar9 = uVar11;
        if (bVar5) goto LAB_00143a40;
LAB_00143b86:
        uVar11 = uVar9;
        if ((int)uVar11 < 1) {
          *tag = iVar12;
          local_54 = llist[uVar14 - 1];
          if ((int)local_54 < 1) {
            return;
          }
          goto LAB_00143779;
        }
        uVar10 = (ulong)uVar11;
        if (dbakw[uVar10 - 1] == 0) break;
        bVar5 = false;
LAB_00143a2e:
        uVar10 = (ulong)(int)uVar11;
      }
      *tag = *tag + 1;
      iVar13 = xadj[uVar10];
      bVar5 = false;
      iVar18 = local_34;
    } while (iVar13 <= xadj[uVar10 - 1]);
    lVar16 = (long)xadj[uVar10 - 1];
    do {
      uVar21 = (ulong)adjncy[lVar16 + -1];
      if (uVar21 == 0) break;
      if (marker[uVar21 - 1] < *tag) {
        marker[uVar21 - 1] = *tag;
        if (dforw[uVar21 - 1] < 0) {
          while( true ) {
            iVar17 = xadj[uVar21];
            if (iVar17 <= xadj[uVar21 - 1]) break;
            lVar15 = (long)xadj[uVar21 - 1];
            while( true ) {
              iVar4 = adjncy[lVar15 + -1];
              lVar22 = (long)iVar4;
              if (lVar22 < 0) break;
              if (iVar4 == 0) goto LAB_001439bf;
              if (marker[lVar22 + -1] < *tag) {
                marker[lVar22 + -1] = *tag;
                iVar18 = iVar18 + qsize[lVar22 + -1];
              }
              lVar15 = lVar15 + 1;
              if (iVar17 <= lVar15) goto LAB_001439bf;
            }
            uVar21 = (ulong)(uint)-iVar4;
          }
        }
        else {
          iVar18 = iVar18 + qsize[uVar21 - 1];
        }
      }
LAB_001439bf:
      lVar16 = lVar16 + 1;
    } while (iVar13 != (int)lVar16);
    bVar5 = false;
  } while( true );
LAB_00143b69:
  iVar13 = xadj[(ulong)-uVar9 - 1];
  iVar17 = xadj[-uVar9];
  if (iVar17 <= iVar13) goto LAB_001439dc;
  goto LAB_00143ab9;
}

Assistant:

void mmdupd_(int* ehead, int* neqns, int* xadj, int* adjncy, int* delta,
            int* mdeg, int* dhead, int* dforw, int* dbakw, int* qsize,
            int* llist, int* marker, int* maxint, int* tag)
{
    /* System generated locals */
    int i__1, i__2;

    /* Local variables */
    static int node, mtag, link, mdeg0, i, j, enode, fnode, nabor, elmnt,
            istop, jstop, q2head, istrt, jstrt, qxhead, iq2, deg, deg0;


/* *************************************************************** */

/*         INTEGER*2  ADJNCY(1), DBAKW(1) , DFORW(1) , DHEAD(1) , */
/*     1              LLIST(1) , MARKER(1), QSIZE(1) */

/* *************************************************************** */

    /* Parameter adjustments */
    --marker; --llist; --qsize; --dbakw; --dforw; --dhead;
    --adjncy; --xadj;

    /* Function Body */
    mdeg0 = *mdeg + *delta;
    elmnt = *ehead;
L100:
/*            ------------------------------------------------------- */
/*            FOR EACH OF THE NEWLY FORMED ELEMENT, DO THE FOLLOWING. */
/*            (RESET TAG VALUE IF NECESSARY.) */
/*            ------------------------------------------------------- */
    if (elmnt <= 0) {
        return;
    }
    mtag = *tag + mdeg0;
    if (mtag < *maxint) {
        goto L300;
    }
    *tag = 1;
    i__1 = *neqns;
    for (i = 1; i <= i__1; ++i) {
        if (marker[i] < *maxint) {
            marker[i] = 0;
        }
/* L200: */
    }
    mtag = *tag + mdeg0;
L300:
/*            --------------------------------------------- */
/*            CREATE TWO LINKED LISTS FROM NODES ASSOCIATED */
/*            WITH ELMNT: ONE WITH TWO NABORS (Q2HEAD) IN */
/*            ADJACENCY STRUCTURE, AND THE OTHER WITH MORE */
/*            THAN TWO NABORS (QXHEAD).  ALSO COMPUTE DEG0, */
/*            NUMBER OF NODES IN THIS ELEMENT. */
/*            --------------------------------------------- */
    q2head = 0;
    qxhead = 0;
    deg0 = 0;
    link = elmnt;
L400:
    istrt = xadj[link];
    istop = xadj[link + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
        enode = adjncy[i];
        link = -enode;
        if (enode < 0) {
            goto L400;
        } else if (enode == 0) {
            goto L800;
        } else {
            goto L500;
        }

L500:
        if (qsize[enode] == 0) {
            goto L700;
        }
        deg0 += qsize[enode];
        marker[enode] = mtag;
/*                        ---------------------------------- */
/*                        IF ENODE REQUIRES A DEGREE UPDATE, */
/*                        THEN DO THE FOLLOWING. */
/*                        ---------------------------------- */
        if (dbakw[enode] != 0) {
            goto L700;
        }
/*                            ---------------------------------------
*/
/*                            PLACE EITHER IN QXHEAD OR Q2HEAD LISTS.
*/
/*                            ---------------------------------------
*/
        if (dforw[enode] == 2) {
            goto L600;
        }
        llist[enode] = qxhead;
        qxhead = enode;
        goto L700;
L600:
        llist[enode] = q2head;
        q2head = enode;
L700:
        ;
    }
L800:
/*            -------------------------------------------- */
/*            FOR EACH ENODE IN Q2 LIST, DO THE FOLLOWING. */
/*            -------------------------------------------- */
    enode = q2head;
    iq2 = 1;
L900:
    if (enode <= 0) {
        goto L1500;
    }
    if (dbakw[enode] != 0) {
        goto L2200;
    }
    ++(*tag);
    deg = deg0;
/*                    ------------------------------------------ */
/*                    IDENTIFY THE OTHER ADJACENT ELEMENT NABOR. */
/*                    ------------------------------------------ */
    istrt = xadj[enode];
    nabor = adjncy[istrt];
    if (nabor == elmnt) {
        nabor = adjncy[istrt + 1];
    }
/*                    ------------------------------------------------ */
/*                    IF NABOR IS UNELIMINATED, INCREASE DEGREE COUNT. */
/*                    ------------------------------------------------ */
    link = nabor;
    if (dforw[nabor] < 0) {
        goto L1000;
    }
    deg += qsize[nabor];
    goto L2100;
L1000:
/*                        -------------------------------------------- */
/*                        OTHERWISE, FOR EACH NODE IN THE 2ND ELEMENT, */
/*                        DO THE FOLLOWING. */
/*                        -------------------------------------------- */
    istrt = xadj[link];
    istop = xadj[link + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
        node = adjncy[i];
        link = -node;
        if (node == enode) {
            goto L1400;
        }
        if (node < 0) {
            goto L1000;
        } else if (node == 0) {
            goto L2100;
        } else {
            goto L1100;
        }

L1100:
        if (qsize[node] == 0) {
            goto L1400;
        }
        if (marker[node] >= *tag) {
            goto L1200;
        }
/*                                -----------------------------------
-- */
/*                                CASE WHEN NODE IS NOT YET CONSIDERED
. */
/*                                -----------------------------------
-- */
        marker[node] = *tag;
        deg += qsize[node];
        goto L1400;
L1200:
/*                            ----------------------------------------
 */
/*                            CASE WHEN NODE IS INDISTINGUISHABLE FROM
 */
/*                            ENODE.  MERGE THEM INTO A NEW SUPERNODE.
 */
/*                            ----------------------------------------
 */
        if (dbakw[node] != 0) {
            goto L1400;
        }
        if (dforw[node] != 2) {
            goto L1300;
        }
        qsize[enode] += qsize[node];
        qsize[node] = 0;
        marker[node] = *maxint;
        dforw[node] = -enode;
        dbakw[node] = -(*maxint);
        goto L1400;
L1300:
/*                            --------------------------------------
*/
/*                            CASE WHEN NODE IS OUTMATCHED BY ENODE.
*/
/*                            --------------------------------------
*/
        if (dbakw[node] == 0) {
            dbakw[node] = -(*maxint);
        }
L1400:
        ;
    }
    goto L2100;
L1500:
/*                ------------------------------------------------ */
/*                FOR EACH ENODE IN THE QX LIST, DO THE FOLLOWING. */
/*                ------------------------------------------------ */
    enode = qxhead;
    iq2 = 0;
L1600:
    if (enode <= 0) {
        goto L2300;
    }
    if (dbakw[enode] != 0) {
        goto L2200;
    }
    ++(*tag);
    deg = deg0;
/*                        --------------------------------- */
/*                        FOR EACH UNMARKED NABOR OF ENODE, */
/*                        DO THE FOLLOWING. */
/*                        --------------------------------- */
    istrt = xadj[enode];
    istop = xadj[enode + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
        nabor = adjncy[i];
        if (nabor == 0) {
            goto L2100;
        }
        if (marker[nabor] >= *tag) {
            goto L2000;
        }
        marker[nabor] = *tag;
        link = nabor;
/*                                ------------------------------ */
/*                                IF UNELIMINATED, INCLUDE IT IN */
/*                                DEG COUNT. */
/*                                ------------------------------ */
        if (dforw[nabor] < 0) {
            goto L1700;
        }
        deg += qsize[nabor];
        goto L2000;
L1700:
/*                                    -------------------------------
*/
/*                                    IF ELIMINATED, INCLUDE UNMARKED
*/
/*                                    NODES IN THIS ELEMENT INTO THE
*/
/*                                    DEGREE COUNT. */
/*                                    -------------------------------
*/
        jstrt = xadj[link];
        jstop = xadj[link + 1] - 1;
        i__2 = jstop;
        for (j = jstrt; j <= i__2; ++j) {
            node = adjncy[j];
            link = -node;
            if (node < 0) {
                goto L1700;
            } else if (node == 0) {
                goto L2000;
            } else {
                goto L1800;
            }

L1800:
            if (marker[node] >= *tag) {
                goto L1900;
            }
            marker[node] = *tag;
            deg += qsize[node];
L1900:
            ;
        }
L2000:
        ;
    }
L2100:
/*                    ------------------------------------------- */
/*                    UPDATE EXTERNAL DEGREE OF ENODE IN DEGREE */
/*                    STRUCTURE, AND MDEG (MIN DEG) IF NECESSARY. */
/*                    ------------------------------------------- */
    deg = deg - qsize[enode] + 1;
    fnode = dhead[deg];
    dforw[enode] = fnode;
    dbakw[enode] = -deg;
    if (fnode > 0) {
        dbakw[fnode] = enode;
    }
    dhead[deg] = enode;
    if (deg < *mdeg) {
        *mdeg = deg;
    }
L2200:
/*                    ---------------------------------- */
/*                    GET NEXT ENODE IN CURRENT ELEMENT. */
/*                    ---------------------------------- */
    enode = llist[enode];
    if (iq2 == 1) {
        goto L900;
    }
    goto L1600;
L2300:
/*            ----------------------------- */
/*            GET NEXT ELEMENT IN THE LIST. */
/*            ----------------------------- */
    *tag = mtag;
    elmnt = llist[elmnt];
    goto L100;

}